

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O3

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *e,undefined8 param_2)

{
  rt_expression_interface<double> *prVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  
  prVar1 = (rt_expression_interface<double> *)operator_new(0x20);
  pp_Var2 = (_func_int **)operator_new(0x18);
  p_Var3 = (_func_int *)(**(code **)(*e + 0x10))(e);
  p_Var4 = (_func_int *)operator_new(0x10);
  *(undefined ***)p_Var4 = &PTR__op_interface_0011e878;
  *pp_Var2 = (_func_int *)&PTR__rt_unary_expr_0011e088;
  pp_Var2[1] = p_Var3;
  pp_Var2[2] = p_Var4;
  pp_Var5 = (_func_int **)operator_new(8);
  *pp_Var5 = (_func_int *)&PTR__op_interface_0011e538;
  pp_Var6 = (_func_int **)(**(code **)(*e + 0x90))(e,param_2);
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_0011e158;
  prVar1[1]._vptr_rt_expression_interface = pp_Var2;
  prVar1[2]._vptr_rt_expression_interface = pp_Var5;
  prVar1[3]._vptr_rt_expression_interface = pp_Var6;
  return prVar1;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_sin<NumericT>, const InterfaceType * diff_var)
  {
    return new rt_binary_expr<InterfaceType>( new rt_unary_expr<InterfaceType>(e->clone(), new op_unary<op_cos<NumericT>, InterfaceType>()),
                                           new op_binary<op_mult<typename InterfaceType::numeric_type>, InterfaceType>(),
                                           e->diff(diff_var) );
  }